

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# label_test.cpp
# Opt level: O2

void __thiscall
jhu::thrax::LabelTests_PrintHieroMixed2_Test::~LabelTests_PrintHieroMixed2_Test
          (LabelTests_PrintHieroMixed2_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(LabelTests, PrintHieroMixed2) {
  auto asp = readAlignedSentencePair<false, false>("a c\tb d e\t0-0");
  std::ostringstream s;
  PhrasalRule rule{asp};
  rule.nts[0] = NT({{0, 1}, {0, 1}}, "X");
  rule.nts[1] = NT({{1, 2}, {2, 3}}, "X");
  auto nt = rule.nts[0].span;
  nt = rule.nts[1].span;
  s << rule;
  EXPECT_EQ("[X]\t[X,1] [X,2]\t[X,1] d [X,2]\t", s.str());
}